

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

ch_primitive * ch_table_get(ch_table *table,ch_string *key)

{
  ch_table_entry *pcVar1;
  ch_table_entry *pcVar2;
  ch_primitive *pcVar3;
  uint uVar4;
  uint32_t uVar5;
  
  if (table->size == 0) {
    return (ch_primitive *)0x0;
  }
  uVar5 = key->hash;
  pcVar1 = (ch_table_entry *)0x0;
  do {
    uVar4 = uVar5 & table->capacity - 1;
    pcVar2 = table->entries + uVar4;
    if (pcVar2->key == (ch_string *)0x0) {
      if (pcVar1 == (ch_table_entry *)0x0) {
        pcVar1 = pcVar2;
      }
      if ((pcVar2->value).type == PRIMITIVE_NULL) {
        key = pcVar1->key;
        pcVar2 = pcVar1;
LAB_001049b5:
        pcVar3 = &pcVar2->value;
        if (key == (ch_string *)0x0) {
          pcVar3 = (ch_primitive *)0x0;
        }
        return pcVar3;
      }
    }
    else if (pcVar2->key == key) goto LAB_001049b5;
    uVar5 = uVar4 + 1;
  } while( true );
}

Assistant:

ch_primitive *ch_table_get(ch_table *table, ch_string *key) {
  if (table->size == 0)
    return NULL;

  ch_table_entry *entry = find_entry(table->entries, table->capacity, key);
  if (entry->key == NULL)
    return NULL;

  return &entry->value;
}